

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

unsigned_long adios2sys::Directory::GetNumberOfFilesInDirectory(string *name,string *errorMessage)

{
  int *piVar1;
  char *pcVar2;
  string *in_RSI;
  dirent *d;
  unsigned_long count;
  DIR *dir;
  allocator local_89;
  string local_88 [32];
  dirent *local_68;
  unsigned_long local_60;
  allocator local_41;
  string local_40 [32];
  DIR *local_20;
  string *local_18;
  unsigned_long local_8;
  
  local_18 = in_RSI;
  piVar1 = __errno_location();
  *piVar1 = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_20 = opendir(pcVar2);
  if (local_20 == (DIR *)0x0) {
    if (local_18 != (string *)0x0) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar2,&local_41);
      std::__cxx11::string::operator=(local_18,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    local_8 = 0;
  }
  else {
    local_60 = 0;
    local_68 = readdir(local_20);
    while (local_68 != (dirent *)0x0) {
      local_60 = local_60 + 1;
      local_68 = readdir(local_20);
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      closedir(local_20);
      local_8 = local_60;
    }
    else {
      if (local_18 != (string *)0x0) {
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,pcVar2,&local_89);
        std::__cxx11::string::operator=(local_18,local_88);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

unsigned long Directory::GetNumberOfFilesInDirectory(const std::string& name,
                                                     std::string* errorMessage)
{
  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage) {
      *errorMessage = std::string(strerror(errno));
    }
    return 0;
  }

  unsigned long count = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    count++;
  }
  if (errno != 0) {
    if (errorMessage) {
      *errorMessage = std::string(strerror(errno));
    }
    return false;
  }

  closedir(dir);
  return count;
}